

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  stbi_uc *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  stbi__uint16 *psVar11;
  long lVar12;
  char *pcVar13;
  long *in_FS_OFFSET;
  
  lVar4 = 0;
  pcVar13 = "bad size list";
  iVar6 = 0;
  do {
    if (0 < count[lVar4]) {
      iVar10 = 0x100;
      if (0x100 < iVar6) {
        iVar10 = iVar6;
      }
      lVar12 = 0;
      do {
        h->size[lVar12 + iVar6] = (char)lVar4 + '\x01';
        if ((iVar6 - iVar10) + (int)lVar12 == 0) goto LAB_001449af;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 < count[lVar4]);
      iVar6 = iVar6 + (int)lVar12;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  h->size[iVar6] = '\0';
  uVar9 = 0;
  uVar2 = 1;
  pcVar13 = "bad code lengths";
  uVar7 = 0;
  do {
    h->delta[uVar2] = uVar7 - uVar9;
    if (uVar2 == h->size[(int)uVar7]) {
      psVar11 = h->code + (int)uVar7;
      psVar5 = h->size + (long)(int)uVar7 + 1;
      do {
        uVar8 = uVar9;
        *psVar11 = (stbi__uint16)uVar8;
        uVar9 = uVar8 + 1;
        bVar3 = *psVar5;
        psVar11 = psVar11 + 1;
        uVar7 = uVar7 + 1;
        psVar5 = psVar5 + 1;
      } while (uVar2 == bVar3);
      if (uVar8 >> ((byte)uVar2 & 0x1f) != 0) {
LAB_001449af:
        *(char **)(*in_FS_OFFSET + -0x20) = pcVar13;
        return 0;
      }
    }
    h->maxcode[uVar2] = uVar9 << (0x10 - (byte)uVar2 & 0x1f);
    uVar9 = uVar9 * 2;
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      if (0 < (int)uVar7) {
        uVar2 = 0;
        do {
          if (h->size[uVar2] < 10) {
            uVar1 = h->code[uVar2];
            bVar3 = 9 - h->size[uVar2];
            lVar4 = 0;
            do {
              h->fast[lVar4 + ((ulong)uVar1 << (bVar3 & 0x3f))] = (stbi_uc)uVar2;
              lVar4 = lVar4 + 1;
            } while ((uint)lVar4 >> (bVar3 & 0x1f) == 0);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != uVar7);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i) {
      for (j=0; j < count[i]; ++j) {
         h->size[k++] = (stbi_uc) (i+1);
         if(k >= 257) return stbi__err("bad size list","Corrupt JPEG");
      }
   }
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}